

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<bool_(const_pstore::brokerface::message_type_&)>::Invoke
          (FunctionMocker<bool_(const_pstore::brokerface::message_type_&)> *this,message_type *args)

{
  bool bVar1;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<bool> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  local_28;
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  holder;
  ArgumentTuple tuple;
  message_type *args_local;
  FunctionMocker<bool_(const_pstore::brokerface::message_type_&)> *this_local;
  
  std::tuple<const_pstore::brokerface::message_type_&>::tuple<true,_true>
            ((tuple<const_pstore::brokerface::message_type_&> *)&holder,args);
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<bool>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<bool>,std::default_delete<testing::internal::ActionResultHolder<bool>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<bool>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<bool>,std::default_delete<testing::internal::ActionResultHolder<bool>>>
              *)&local_28,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
            ::operator->(&local_28);
  bVar1 = ActionResultHolder<bool>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<bool>,_std::default_delete<testing::internal::ActionResultHolder<bool>_>_>
  ::~unique_ptr(&local_28);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }